

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMappedVector.hpp
# Opt level: O1

optional<unsigned_long> __thiscall
gmlc::containers::
StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
::insert<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>
          (StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
           *this,string_view searchValue,
          unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *data)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar4;
  optional<unsigned_long> oVar5;
  size_t index;
  _Storage<unsigned_long,_true> local_30;
  key_type local_28;
  
  local_28._M_str = searchValue._M_str;
  local_28._M_len = searchValue._M_len;
  local_30 = (_Storage<unsigned_long,_true>)
             std::
             _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(this + 0x60),&local_28);
  if ((__node_type *)local_30._M_value == (__node_type *)0x0) {
    local_30 = *(_Storage<unsigned_long,_true> *)this;
    StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
    ::blockCheck((StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
                  *)this);
    lVar3 = *(long *)(*(long *)(this + 8) + (long)*(int *)(this + 0x14) * 8);
    iVar1 = *(int *)(this + 0x18);
    *(int *)(this + 0x18) = iVar1 + 1;
    *(Filter **)(lVar3 + (long)iVar1 * 8) =
         (data->_M_t).super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>.
         _M_t.super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
         super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
    (data->_M_t).super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
    super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
    super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = (Filter *)0x0;
    *(long *)this = *(long *)this + 1;
    StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>> *)
               (this + 0x30),&local_28);
    if ((long)*(int *)(this + 0x48) == 0) {
      lVar3 = *(long *)(*(long *)(this + 0x38) + -8 + (*(ulong *)(this + 0x30) >> 5) * 8) + 0x3e0;
    }
    else {
      lVar3 = *(long *)(*(long *)(this + 0x38) + (long)*(int *)(this + 0x44) * 8) +
              (long)*(int *)(this + 0x48) * 0x20 + -0x20;
    }
    pVar4 = std::
            _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string&,unsigned_long&>
                      ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)(this + 0x60),lVar3,&local_30);
    uVar2 = CONCAT71(pVar4._9_7_,1);
  }
  else {
    uVar2 = 0;
  }
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_30._M_value;
  return (optional<unsigned_long>)
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(std::string_view searchValue, Us&&... data)
        {
            auto fnd = lookup.find(searchValue);
            if (fnd != lookup.end()) {
                return std::nullopt;
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            names.emplace_back(searchValue);
            lookup.emplace(names.back(), index);
            return index;
        }